

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultIoResolver::resolveBinding
          (TDefaultIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  bool bVar1;
  int iVar2;
  uint set_00;
  uint uVar3;
  TResourceType res;
  int iVar4;
  undefined4 extraout_var;
  SpvVersion *pSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int local_4c;
  TResourceType resource;
  int numBindings;
  int set;
  TType *type;
  TVarEntryInfo *ent_local;
  EShLanguage stage_local;
  TDefaultIoResolver *this_local;
  TType *type_00;
  
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  type_00 = (TType *)CONCAT44(extraout_var,iVar2);
  set_00 = TDefaultIoResolverBase::getLayoutSet(type_00);
  pSVar5 = TIntermediate::getSpv((this->super_TDefaultIoResolverBase).referenceIntermediate);
  if ((pSVar5->openGl == 0) || (uVar3 = (*type_00->_vptr_TType[0x1e])(), (uVar3 & 1) == 0)) {
    local_4c = 1;
  }
  else {
    local_4c = (*type_00->_vptr_TType[0x11])();
  }
  res = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                  (this,type_00);
  if ((int)res < 6) {
    iVar2 = (*type_00->_vptr_TType[0xb])();
    bVar1 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      iVar2 = TDefaultIoResolverBase::getBaseBinding
                        (&this->super_TDefaultIoResolverBase,stage,res,set_00);
      iVar4 = (*type_00->_vptr_TType[0xb])();
      iVar2 = TDefaultIoResolverBase::reserveSlot
                        (&this->super_TDefaultIoResolverBase,set_00,
                         iVar2 + ((uint)((ulong)*(undefined8 *)
                                                 (CONCAT44(extraout_var_01,iVar4) + 0x1c) >> 0x20) &
                                 0xffff),local_4c);
      ent->newBinding = iVar2;
      return iVar2;
    }
    if (((ent->live & 1U) != 0) &&
       (bVar1 = TDefaultIoResolverBase::doAutoBindingMapping(&this->super_TDefaultIoResolverBase),
       bVar1)) {
      iVar2 = TDefaultIoResolverBase::getBaseBinding
                        (&this->super_TDefaultIoResolverBase,stage,res,set_00);
      iVar2 = TDefaultIoResolverBase::getFreeSlot
                        (&this->super_TDefaultIoResolverBase,set_00,iVar2,local_4c);
      ent->newBinding = iVar2;
      return iVar2;
    }
  }
  ent->newBinding = -1;
  return -1;
}

Assistant:

int resolveBinding(EShLanguage stage, TVarEntryInfo& ent) override {
        const TType& type = ent.symbol->getType();
        const int set = getLayoutSet(type);
        // On OpenGL arrays of opaque types take a seperate binding for each element
        int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
        TResourceType resource = getResourceType(type);
        if (resource < EResCount) {
            if (type.getQualifier().hasBinding()) {
                return ent.newBinding = reserveSlot(
                           set, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            } else if (ent.live && doAutoBindingMapping()) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                return ent.newBinding = getFreeSlot(set, getBaseBinding(stage, resource, set), numBindings);
            }
        }
        return ent.newBinding = -1;
    }